

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yymatchString(GREG *G,char *s)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (*s != '\0') {
    iVar2 = G->pos;
    pcVar4 = s + 1;
    do {
      if ((G->limit <= G->pos) && (iVar3 = yyrefill(G), iVar3 == 0)) {
        return 0;
      }
      if (G->buf[G->pos] != pcVar4[-1]) {
        G->pos = iVar2;
        return 0;
      }
      G->pos = G->pos + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  return 1;
}

Assistant:

YY_LOCAL(int) yymatchString(GREG *G, const char *s)
{
  int yysav= G->pos;
  while (*s)
    {
      if (G->pos >= G->limit && !yyrefill(G)) return 0;
      if (G->buf[G->pos] != *s)
        {
          G->pos= yysav;
          return 0;
        }
      ++s;
      ++G->pos;
    }
  return 1;
}